

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O3

void __thiscall wasm::DataFlowOpts::~DataFlowOpts(DataFlowOpts *this)

{
  pointer pTVar1;
  
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>)
  .super_Pass._vptr_Pass = (_func_int **)&PTR__DataFlowOpts_01071e70;
  DataFlow::Graph::~Graph(&this->graph);
  std::
  _Hashtable<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->workLeft)._M_h);
  std::
  _Hashtable<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->nodeUsers);
  pTVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>
           ).super_PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>.
           super_Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>.stack.flexible
           .
           super__Vector_base<wasm::Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>
                                          .
                                          super_Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x390);
  return;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<DataFlowOpts>();
  }